

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_description-c.cpp
# Opt level: O2

duckdb_state
duckdb_table_description_create_ext
          (duckdb_connection connection,char *catalog,char *schema,char *table,
          duckdb_table_description *out)

{
  undefined8 __p;
  duckdb_table_description this;
  char *pcVar1;
  allocator local_fb;
  allocator local_fa;
  allocator local_f9;
  undefined1 local_f8 [40];
  string local_d0;
  ErrorData error;
  
  if (out != (duckdb_table_description *)0x0) {
    this = (duckdb_table_description)operator_new(0x28);
    *(tuple<duckdb::TableDescription_*,_std::default_delete<duckdb::TableDescription>_> *)this =
         (tuple<duckdb::TableDescription_*,_std::default_delete<duckdb::TableDescription>_>)0x0;
    *(tuple<duckdb::TableDescription_*,_std::default_delete<duckdb::TableDescription>_> *)(this + 8)
         = (tuple<duckdb::TableDescription_*,_std::default_delete<duckdb::TableDescription>_>)0x0;
    *(tuple<duckdb::TableDescription_*,_std::default_delete<duckdb::TableDescription>_> *)
     (this + 0x10) =
         (tuple<duckdb::TableDescription_*,_std::default_delete<duckdb::TableDescription>_>)0x0;
    *(tuple<duckdb::TableDescription_*,_std::default_delete<duckdb::TableDescription>_> *)
     (this + 0x18) =
         (tuple<duckdb::TableDescription_*,_std::default_delete<duckdb::TableDescription>_>)0x0;
    *(tuple<duckdb::TableDescription_*,_std::default_delete<duckdb::TableDescription>_> *)
     (this + 0x20) =
         (tuple<duckdb::TableDescription_*,_std::default_delete<duckdb::TableDescription>_>)0x0;
    *(long *)(this + 8) = (long)this + 0x18;
    this[0x18] = (_duckdb_table_description)0x0;
    *out = this;
    if (table != (char *)0x0 && connection != (duckdb_connection)0x0) {
      pcVar1 = anon_var_dwarf_4b4b1b2 + 9;
      if (catalog != (char *)0x0) {
        pcVar1 = catalog;
      }
      std::__cxx11::string::string((string *)&error,pcVar1,&local_f9);
      pcVar1 = "main";
      if (schema != (char *)0x0) {
        pcVar1 = schema;
      }
      std::__cxx11::string::string((string *)&local_d0,pcVar1,&local_fa);
      std::__cxx11::string::string((string *)(local_f8 + 8),table,&local_fb);
      duckdb::Connection::TableInfo
                ((Connection *)local_f8,(string *)connection,(string *)&error,&local_d0);
      __p = local_f8._0_8_;
      local_f8._0_8_ =
           (__uniq_ptr_impl<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>
            )0x0;
      std::__uniq_ptr_impl<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>
      ::reset((__uniq_ptr_impl<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>
               *)this,(pointer)__p);
      std::unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>::
      ~unique_ptr((unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>
                   *)local_f8);
      std::__cxx11::string::~string((string *)(local_f8 + 8));
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&error);
      if ((_Tuple_impl<0UL,_duckdb::TableDescription_*,_std::default_delete<duckdb::TableDescription>_>
           )*(tuple<duckdb::TableDescription_*,_std::default_delete<duckdb::TableDescription>_> *)
             this !=
          (_Tuple_impl<0UL,_duckdb::TableDescription_*,_std::default_delete<duckdb::TableDescription>_>
           )0x0) {
        return DuckDBSuccess;
      }
      std::__cxx11::string::assign((char *)(this + 8));
    }
  }
  return DuckDBError;
}

Assistant:

duckdb_state duckdb_table_description_create_ext(duckdb_connection connection, const char *catalog, const char *schema,
                                                 const char *table, duckdb_table_description *out) {
	Connection *conn = reinterpret_cast<Connection *>(connection);

	if (!out) {
		return DuckDBError;
	}
	auto wrapper = new TableDescriptionWrapper();
	*out = reinterpret_cast<duckdb_table_description>(wrapper);

	if (!connection || !table) {
		return DuckDBError;
	}
	if (catalog == nullptr) {
		catalog = INVALID_CATALOG;
	}
	if (schema == nullptr) {
		schema = DEFAULT_SCHEMA;
	}

	try {
		wrapper->description = conn->TableInfo(catalog, schema, table);
	} catch (std::exception &ex) {
		ErrorData error(ex);
		wrapper->error = error.RawMessage();
		return DuckDBError;
	} catch (...) { // LCOV_EXCL_START
		wrapper->error = "Unknown Connection::TableInfo error";
		return DuckDBError;
	} // LCOV_EXCL_STOP
	if (!wrapper->description) {
		wrapper->error = "No table with that schema+name could be located";
		return DuckDBError;
	}
	return DuckDBSuccess;
}